

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O2

void __thiscall
t_perl_generator::generate_service_helpers(t_perl_generator *this,t_service *tservice)

{
  t_struct *tstruct;
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  pointer pptVar3;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string name;
  _Vector_base<t_function_*,_std::allocator<t_function_*>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_a8,&tservice->functions_)
  ;
  poVar2 = std::operator<<((ostream *)&this->f_service_,"# HELPER FUNCTIONS AND STRUCTURES");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  for (pptVar3 = local_a8._M_impl.super__Vector_impl_data._M_start;
      pptVar3 != local_a8._M_impl.super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
    tstruct = (*pptVar3)->arglist_;
    iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    std::__cxx11::string::string((string *)&local_50,(string *)CONCAT44(extraout_var,iVar1));
    std::operator+(&local_90,&(this->super_t_oop_generator).super_t_generator.service_name_,"_");
    std::operator+(&local_70,&local_90,&local_50);
    (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[2])(tstruct,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    generate_perl_struct_definition(this,(ostream *)&this->f_service_,tstruct,false);
    generate_perl_function_helpers(this,*pptVar3);
    (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[2])(tstruct,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base(&local_a8);
  return;
}

Assistant:

void t_perl_generator::generate_service_helpers(t_service* tservice) {
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;

  f_service_ << "# HELPER FUNCTIONS AND STRUCTURES" << endl << endl;

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    t_struct* ts = (*f_iter)->get_arglist();
    string name = ts->get_name();
    ts->set_name(service_name_ + "_" + name);
    generate_perl_struct_definition(f_service_, ts, false);
    generate_perl_function_helpers(*f_iter);
    ts->set_name(name);
  }
}